

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  allocator local_4e9;
  _Vector_base<int,_std::allocator<int>_> local_4e8;
  vector<int,_std::allocator<int>_> layer_neuron_num;
  string local_4b8;
  string local_498;
  string local_478;
  Mat input;
  Scalar_<double> local_3f8;
  Mat test_label;
  Mat test_input;
  Mat label;
  Mat local_2b8 [96];
  Mat local_258 [96];
  Net net;
  
  net.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x6400000310;
  net.layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = 10;
  __l._M_len = 3;
  __l._M_array = (iterator)&net;
  std::vector<int,_std::allocator<int>_>::vector(&layer_neuron_num,__l,(allocator_type *)&input);
  liu::Net::Net(&net);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_4e8,&layer_neuron_num);
  liu::Net::initNet(&net,(vector<int,_std::allocator<int>_> *)&local_4e8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4e8);
  liu::Net::initWeights(&net,0,0.0,0.01);
  cv::Scalar_<double>::Scalar_(&local_3f8,0.05);
  liu::Net::initBias(&net,&local_3f8);
  cv::Mat::Mat(&input);
  cv::Mat::Mat(&label);
  cv::Mat::Mat(&test_input);
  cv::Mat::Mat(&test_label);
  std::__cxx11::string::string((string *)&local_478,"data/input_label_1000.xml",&local_4e9);
  liu::get_input_label(&local_478,&input,&label,200,0);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::string((string *)&local_498,"data/input_label_1000.xml",&local_4e9);
  liu::get_input_label(&local_498,&test_input,&test_label,200,800);
  std::__cxx11::string::~string((string *)&local_498);
  net.output_interval = 2;
  net.learning_rate = 0.3;
  std::__cxx11::string::assign((char *)&net.activation_function);
  cv::Mat::Mat(local_258,&input);
  cv::Mat::Mat(local_2b8,&label);
  liu::Net::train(&net,local_258,local_2b8,0.3,true);
  cv::Mat::~Mat(local_2b8);
  cv::Mat::~Mat(local_258);
  liu::Net::test(&net,&test_input,&test_label);
  std::__cxx11::string::string
            ((string *)&local_4b8,"models/model_sigmoid_800_200_test.xml",&local_4e9);
  liu::Net::save(&net,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  getchar();
  cv::Mat::~Mat(&test_label);
  cv::Mat::~Mat(&test_input);
  cv::Mat::~Mat(&label);
  cv::Mat::~Mat(&input);
  liu::Net::~Net(&net);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&layer_neuron_num.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	//Set neuron number of every layer
	vector<int> layer_neuron_num = { 784,100,10 };

	// Initialise Net and weights
	Net net;
	net.initNet(layer_neuron_num);
	net.initWeights(0, 0., 0.01);
	net.initBias(Scalar(0.05));

	//Get test samples and test samples 
	Mat input, label,test_input,test_label;
	int sample_number = 200;
	get_input_label("data/input_label_1000.xml",input, label, sample_number);
	get_input_label("data/input_label_1000.xml", test_input, test_label, 200, 800);

	//Set loss threshold,learning rate and activation function
	float loss_threshold = 0.3;
	net.learning_rate = 0.3;
	net.output_interval = 2;
	net.activation_function = "sigmoid";

	//convert label from 0---1 to -1---1,cause tanh function range is [-1,1]
	//label = 2 * label - 1;

	//Train,and draw the loss curve(cause the last parameter is ture) and test the trained net
	net.train(input, label, loss_threshold,true);
	net.test(test_input, test_label);

	//Save the model
	net.save("models/model_sigmoid_800_200_test.xml");

	getchar();
	return 0;

}